

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

void __thiscall cmCPackIFWGenerator::~cmCPackIFWGenerator(cmCPackIFWGenerator *this)

{
  ~cmCPackIFWGenerator(this);
  operator_delete(this,0x888);
  return;
}

Assistant:

cmCPackIFWGenerator::~cmCPackIFWGenerator() = default;